

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

int N_VInvTest_Serial(N_Vector x,N_Vector z)

{
  double dVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  lVar6 = *x->content;
  lVar2 = *(long *)((long)x->content + 0x10);
  lVar7 = 0;
  if (lVar6 < 1) {
    lVar6 = lVar7;
  }
  lVar3 = *(long *)((long)z->content + 0x10);
  iVar5 = 1;
  for (; lVar6 != lVar7; lVar7 = lVar7 + 1) {
    dVar1 = *(double *)(lVar2 + lVar7 * 8);
    if ((dVar1 != 0.0) || (iVar4 = 0, NAN(dVar1))) {
      *(double *)(lVar3 + lVar7 * 8) = 1.0 / dVar1;
      iVar4 = iVar5;
    }
    iVar5 = iVar4;
  }
  return iVar5;
}

Assistant:

sunbooleantype N_VInvTest_Serial(N_Vector x, N_Vector z)
{
  sunindextype i, N;
  sunrealtype *xd, *zd;
  sunbooleantype no_zero_found;

  xd = zd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  zd = NV_DATA_S(z);

  no_zero_found = SUNTRUE;
  for (i = 0; i < N; i++)
  {
    if (xd[i] == ZERO) { no_zero_found = SUNFALSE; }
    else { zd[i] = ONE / xd[i]; }
  }

  return no_zero_found;
}